

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O2

IndexTensor *
dynet::TensorTools::categorical_sample_log_prob_dev<dynet::Device_CPU>
          (IndexTensor *__return_storage_ptr__,Device_CPU *dev,Tensor *v,uint dim,uint num)

{
  DeviceMempool DVar1;
  Device *pDVar2;
  AlignedMemoryPool *this;
  uint uVar3;
  DenseIndex *pDVar4;
  runtime_error *this_00;
  invalid_argument *this_01;
  TensorTupleReducerOp<Eigen::internal::ArgMaxTupleReducer<Eigen::Tuple<long,_float>_>,_const_std::array<long,_1UL>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_5,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_5,_0,_long>,_0,_Eigen::MakePointer>_>_>_>_>_>
  *other;
  array<Index,_1> in_dims;
  Tensor local_2a8;
  DefaultDevice *local_268;
  TensorMap<Eigen::Tensor<long,_4,_0,_long>,_0,_Eigen::MakePointer> *local_260;
  Dim ids_dim;
  TensorMap<Eigen::Tensor<long,_4,_0,_long>,_0,_Eigen::MakePointer> local_230;
  TensorMap<Eigen::Tensor<float,_5,_0,_long>,_0,_Eigen::MakePointer> local_208;
  TensorMap<Eigen::Tensor<float,_5,_0,_long>,_0,_Eigen::MakePointer> local_1d8;
  ostringstream oss;
  
  if (1 < num) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    std::operator<<((ostream *)&oss,
                    "Currently do not support num > 1 in categorical_sample_log_prob");
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(this_00,(string *)&local_2a8);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  DVar1 = v->mem_pool;
  if (DVar1 != NONE) {
    ids_dim.bd = (v->d).bd;
    ids_dim.d._0_8_ = *(undefined8 *)(v->d).d;
    ids_dim.d._8_8_ = *(undefined8 *)((v->d).d + 2);
    ids_dim.d._16_8_ = *(undefined8 *)((v->d).d + 4);
    ids_dim._24_8_ = *(undefined8 *)((v->d).d + 6);
    ids_dim.d[dim] = num;
    pDVar2 = v->device;
    (__return_storage_ptr__->d).bd = ids_dim.bd;
    *(undefined8 *)((__return_storage_ptr__->d).d + 4) = ids_dim.d._16_8_;
    *(undefined8 *)((__return_storage_ptr__->d).d + 6) = ids_dim._24_8_;
    *(undefined8 *)(__return_storage_ptr__->d).d = ids_dim.d._0_8_;
    *(undefined8 *)((__return_storage_ptr__->d).d + 2) = ids_dim.d._8_8_;
    __return_storage_ptr__->device = pDVar2;
    __return_storage_ptr__->mem_pool = DVar1;
    this = (pDVar2->pools).
           super__Vector_base<dynet::AlignedMemoryPool_*,_std::allocator<dynet::AlignedMemoryPool_*>_>
           ._M_impl.super__Vector_impl_data._M_start[3];
    uVar3 = Dim::size(&ids_dim);
    pDVar4 = (DenseIndex *)AlignedMemoryPool::allocate(this,(ulong)uVar3 << 3);
    __return_storage_ptr__->v = pDVar4;
    local_2a8.d.bd = (v->d).bd;
    local_2a8.d.d._0_8_ = *(undefined8 *)(v->d).d;
    local_2a8.d.d._8_8_ = *(undefined8 *)((v->d).d + 2);
    local_2a8.d.d._16_8_ = *(undefined8 *)((v->d).d + 4);
    local_2a8.d._24_8_ = *(undefined8 *)((v->d).d + 6);
    local_2a8.device = v->device;
    local_2a8.mem_pool = v->mem_pool;
    uVar3 = Dim::size(&v->d);
    local_2a8.v = (float *)AlignedMemoryPool::allocate(this,(ulong)uVar3 << 2);
    randomize_uniform(&local_2a8,0.0,1.0);
    Tensor::tb<4>(&local_1d8,v);
    Tensor::tb<4>(&local_208,&local_2a8);
    other = (TensorTupleReducerOp<Eigen::internal::ArgMaxTupleReducer<Eigen::Tuple<long,_float>_>,_const_std::array<long,_1UL>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_5,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_5,_0,_long>,_0,_Eigen::MakePointer>_>_>_>_>_>
             *)&oss;
    _oss = local_1d8.m_data;
    IndexTensor::tb<3>(&local_230,__return_storage_ptr__);
    local_268 = dev->edevice;
    local_260 = &local_230;
    Eigen::
    TensorDevice<Eigen::TensorMap<Eigen::Tensor<long,4,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
    ::operator=((TensorDevice<Eigen::TensorMap<Eigen::Tensor<long,4,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
                 *)&local_268,other);
    AlignedMemoryPool::free(this,other);
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  std::operator<<((ostream *)&oss,
                  "Input Tensor to TensorTools::argmax must be associated with a memory pool.");
  this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this_01,(string *)&local_2a8);
  __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

IndexTensor TensorTools::categorical_sample_log_prob_dev(const MyDevice & dev, const Tensor& v, unsigned dim, unsigned num) {
  if(num > 1)
    DYNET_RUNTIME_ERR("Currently do not support num > 1 in categorical_sample_log_prob");
  DYNET_ARG_CHECK(v.mem_pool != DeviceMempool::NONE, "Input Tensor to TensorTools::argmax must be associated with a memory pool.");
  Dim ids_dim = v.d; ids_dim.d[dim] = num;
  IndexTensor ids(ids_dim, nullptr, v.device, v.mem_pool);
  AlignedMemoryPool* scratch_allocator = v.device->pools[(int)DeviceMempool::SCS];
  ids.v = static_cast<Eigen::DenseIndex*>(scratch_allocator->allocate(ids_dim.size() * sizeof(Eigen::DenseIndex)));
  Dim copy_dim = v.d; // TODO: make this match num to enable num
  Tensor copy(copy_dim, nullptr, v.device, v.mem_pool);
  copy.v = static_cast<float*>(scratch_allocator->allocate(v.d.size() * sizeof(float)));
  TensorTools::randomize_uniform(copy);
  ids.tb<3>().device(*dev.edevice) = (v.tb<4>() - (-copy.tb<4>().log()).log()).argmax(dim);
  scratch_allocator->free();
  return ids;
}